

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O0

pint p_ini_file_parameter_int(PIniFile *file,pchar *section,pchar *key,pint default_val)

{
  pchar *__nptr;
  pint ret;
  pchar *val;
  pint default_val_local;
  pchar *key_local;
  pchar *section_local;
  PIniFile *file_local;
  
  __nptr = pp_ini_file_find_parameter(file,section,key);
  file_local._4_4_ = default_val;
  if (__nptr != (pchar *)0x0) {
    file_local._4_4_ = atoi(__nptr);
    p_free(__nptr);
  }
  return file_local._4_4_;
}

Assistant:

P_LIB_API pint
p_ini_file_parameter_int (const PIniFile	*file,
			  const pchar		*section,
			  const pchar		*key,
			  pint			default_val)
{
	pchar	*val;
	pint	ret;

	if ((val = pp_ini_file_find_parameter (file, section, key)) == NULL)
		return default_val;

	ret = atoi (val);
	p_free (val);

	return ret;
}